

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::EscapeForShell_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view str,bool makeVars,
          bool forEcho,bool useWatcomQuote,bool unescapeNinjaConfiguration,bool forResponse)

{
  bool bVar1;
  cmState *pcVar2;
  int flags_00;
  cmOutputConverter *pcVar3;
  string_view in;
  uint local_58;
  int flags;
  allocator<char> local_41;
  cmOutputConverter *local_40;
  char *local_38;
  byte local_2d;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  bool forResponse_local;
  bool unescapeNinjaConfiguration_local;
  bool useWatcomQuote_local;
  bool forEcho_local;
  cmOutputConverter *pcStack_28;
  bool makeVars_local;
  cmOutputConverter *this_local;
  string_view str_local;
  
  local_38 = str._M_str;
  local_40 = (cmOutputConverter *)str._M_len;
  local_2b = useWatcomQuote;
  local_2c = unescapeNinjaConfiguration;
  local_2d = forResponse;
  pcVar3 = this;
  local_2a = forEcho;
  local_29 = makeVars;
  pcStack_28 = this;
  this_local = local_40;
  str_local._M_len = (size_t)local_38;
  str_local._M_str = (char *)__return_storage_ptr__;
  bVar1 = cmOutputConverterIsShellOperator(str);
  flags_00 = (int)pcVar3;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_41);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    pcVar2 = GetState(this);
    bVar1 = cmState::UseWindowsVSIDE(pcVar2);
    if (bVar1) {
      local_58 = 2;
    }
    else {
      local_58 = (uint)((this->LinkScriptShell & 1U) == 0);
    }
    if ((local_2c & 1) != 0) {
      local_58 = local_58 | 0x200;
    }
    if ((local_29 & 1) != 0) {
      local_58 = local_58 | 0x40;
    }
    if ((local_2a & 1) != 0) {
      local_58 = local_58 | 4;
    }
    if ((local_2b & 1) != 0) {
      local_58 = local_58 | 0x80;
    }
    if ((local_2d & 1) != 0) {
      local_58 = local_58 | 0x400;
    }
    pcVar2 = GetState(this);
    bVar1 = cmState::UseWatcomWMake(pcVar2);
    if (bVar1) {
      local_58 = local_58 | 8;
    }
    pcVar2 = GetState(this);
    bVar1 = cmState::UseMinGWMake(pcVar2);
    if (bVar1) {
      local_58 = local_58 | 0x10;
    }
    pcVar2 = GetState(this);
    bVar1 = cmState::UseNMake(pcVar2);
    if (bVar1) {
      local_58 = local_58 | 0x20;
    }
    pcVar2 = GetState(this);
    bVar1 = cmState::UseWindowsShell(pcVar2);
    if (!bVar1) {
      local_58 = local_58 | 0x100;
    }
    in._M_str._0_4_ = local_58;
    in._M_len = str_local._M_len;
    in._M_str._4_4_ = 0;
    Shell_GetArgument_abi_cxx11_(__return_storage_ptr__,this_local,in,flags_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(cm::string_view str,
                                              bool makeVars, bool forEcho,
                                              bool useWatcomQuote,
                                              bool unescapeNinjaConfiguration,
                                              bool forResponse) const
{
  // Do not escape shell operators.
  if (cmOutputConverterIsShellOperator(str)) {
    return std::string(str);
  }

  // Compute the flags for the target shell environment.
  int flags = 0;
  if (this->GetState()->UseWindowsVSIDE()) {
    flags |= Shell_Flag_VSIDE;
  } else if (!this->LinkScriptShell) {
    flags |= Shell_Flag_Make;
  }
  if (unescapeNinjaConfiguration) {
    flags |= Shell_Flag_UnescapeNinjaConfiguration;
  }
  if (makeVars) {
    flags |= Shell_Flag_AllowMakeVariables;
  }
  if (forEcho) {
    flags |= Shell_Flag_EchoWindows;
  }
  if (useWatcomQuote) {
    flags |= Shell_Flag_WatcomQuote;
  }
  if (forResponse) {
    flags |= Shell_Flag_IsResponse;
  }
  if (this->GetState()->UseWatcomWMake()) {
    flags |= Shell_Flag_WatcomWMake;
  }
  if (this->GetState()->UseMinGWMake()) {
    flags |= Shell_Flag_MinGWMake;
  }
  if (this->GetState()->UseNMake()) {
    flags |= Shell_Flag_NMake;
  }
  if (!this->GetState()->UseWindowsShell()) {
    flags |= Shell_Flag_IsUnix;
  }

  return Shell_GetArgument(str, flags);
}